

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O1

void Nwk_ManDelayTraceSortPins(Nwk_Obj_t *pNode,int *pPinPerm,float *pPinDelays)

{
  ulong uVar1;
  int iVar2;
  Nwk_Obj_t **ppNVar3;
  Nwk_Obj_t *pNVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (0 < pNode->nFanins) {
    ppNVar3 = pNode->pFanio;
    lVar8 = 0;
    do {
      pNVar4 = ppNVar3[lVar8];
      if (pNVar4 == (Nwk_Obj_t *)0x0) break;
      pPinPerm[lVar8] = (int)lVar8;
      pPinDelays[lVar8] = pNVar4->tArrival;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pNode->nFanins);
  }
  uVar6 = pNode->nFanins;
  uVar7 = (ulong)uVar6;
  if (1 < (int)uVar6) {
    uVar9 = 1;
    uVar11 = 0;
    do {
      uVar1 = uVar11 + 1;
      uVar10 = uVar11 & 0xffffffff;
      if ((long)uVar1 < (long)(int)uVar7) {
        uVar10 = uVar11 & 0xffffffff;
        uVar12 = uVar9;
        do {
          uVar5 = uVar12 & 0xffffffff;
          if (pPinDelays[pPinPerm[uVar12]] < pPinDelays[pPinPerm[(int)uVar10]] ||
              pPinDelays[pPinPerm[uVar12]] == pPinDelays[pPinPerm[(int)uVar10]]) {
            uVar5 = uVar10;
          }
          uVar10 = uVar5;
          uVar12 = uVar12 + 1;
        } while ((uVar7 & 0xffffffff) != uVar12);
      }
      if (uVar11 != uVar10) {
        iVar2 = pPinPerm[uVar11];
        pPinPerm[uVar11] = pPinPerm[(int)uVar10];
        pPinPerm[(int)uVar10] = iVar2;
      }
      uVar6 = pNode->nFanins;
      uVar7 = (ulong)(int)uVar6;
      uVar9 = uVar9 + 1;
      uVar11 = uVar1;
    } while ((long)uVar1 < (long)(uVar7 - 1));
  }
  if ((uVar6 != 0) && ((int)uVar6 <= *pPinPerm)) {
    __assert_fail("Nwk_ObjFaninNum(pNode) == 0 || pPinPerm[0] < Nwk_ObjFaninNum(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkTiming.c"
                  ,0x5c,"void Nwk_ManDelayTraceSortPins(Nwk_Obj_t *, int *, float *)");
  }
  if (1 < (int)uVar6) {
    uVar7 = 1;
    do {
      if ((int)uVar6 <= pPinPerm[uVar7]) {
        __assert_fail("pPinPerm[i] < Nwk_ObjFaninNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkTiming.c"
                      ,0x5f,"void Nwk_ManDelayTraceSortPins(Nwk_Obj_t *, int *, float *)");
      }
      if (pPinDelays[pPinPerm[uVar7 - 1]] < pPinDelays[pPinPerm[uVar7]]) {
        __assert_fail("pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkTiming.c"
                      ,0x60,"void Nwk_ManDelayTraceSortPins(Nwk_Obj_t *, int *, float *)");
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  return;
}

Assistant:

void Nwk_ManDelayTraceSortPins( Nwk_Obj_t * pNode, int * pPinPerm, float * pPinDelays )
{
    Nwk_Obj_t * pFanin;
    int i, j, best_i, temp;
    // start the trivial permutation and collect pin delays
    Nwk_ObjForEachFanin( pNode, pFanin, i )
    {
        pPinPerm[i] = i;
        pPinDelays[i] = Nwk_ObjArrival(pFanin);
    }
    // selection sort the pins in the decreasible order of delays
    // this order will match the increasing order of LUT input pins
    for ( i = 0; i < Nwk_ObjFaninNum(pNode)-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < Nwk_ObjFaninNum(pNode); j++ )
            if ( pPinDelays[pPinPerm[j]] > pPinDelays[pPinPerm[best_i]] )
                best_i = j;
        if ( best_i == i )
            continue;
        temp = pPinPerm[i]; 
        pPinPerm[i] = pPinPerm[best_i]; 
        pPinPerm[best_i] = temp;
    }
    // verify
    assert( Nwk_ObjFaninNum(pNode) == 0 || pPinPerm[0] < Nwk_ObjFaninNum(pNode) );
    for ( i = 1; i < Nwk_ObjFaninNum(pNode); i++ )
    {
        assert( pPinPerm[i] < Nwk_ObjFaninNum(pNode) );
        assert( pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]] );
    }
}